

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O3

void __thiscall String::detach(String *this,usize copyLength,usize minCapacity)

{
  usize *puVar1;
  code *pcVar2;
  int iVar3;
  Data *pDVar4;
  EVP_PKEY_CTX *src;
  Data *pDVar5;
  
  if (minCapacity < copyLength) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/String.hpp"
                          ,0x1ef,"copyLength <= minCapacity");
    if (iVar3 != 0) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  pDVar5 = this->data;
  if ((pDVar5->ref == 1) && (minCapacity <= pDVar5->capacity)) {
    pDVar5->len = copyLength;
    pDVar5->str[copyLength] = '\0';
  }
  else {
    pDVar4 = (Data *)operator_new__((minCapacity | 3) + 0x21);
    pDVar4->str = (char *)(pDVar4 + 1);
    src = (EVP_PKEY_CTX *)pDVar5->len;
    if (src == (EVP_PKEY_CTX *)0x0) {
      *(undefined1 *)&pDVar4[1].str = 0;
      pDVar4->len = copyLength;
    }
    else {
      if (copyLength <= src) {
        src = (EVP_PKEY_CTX *)copyLength;
      }
      Memory::copy((Memory *)(pDVar4 + 1),(EVP_PKEY_CTX *)pDVar5->str,src);
      pDVar4->len = copyLength;
      pDVar4->str[copyLength] = '\0';
      pDVar5 = this->data;
    }
    pDVar4->ref = 1;
    pDVar4->capacity = minCapacity | 3;
    if (pDVar5->ref != 0) {
      LOCK();
      puVar1 = &pDVar5->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (this->data != (Data *)0x0)) {
        operator_delete__(this->data);
      }
    }
    this->data = pDVar4;
  }
  return;
}

Assistant:

void detach(usize copyLength, usize minCapacity)
  {
#ifdef ASSERT
    ASSERT(copyLength <= minCapacity);
#endif
    if(data->ref == 1 && minCapacity <= data->capacity)
    {
      ((char*)data->str)[data->len = copyLength] = '\0';
      return;
    }

    usize capacity = minCapacity | 0x3;
    Data* newData = (Data*)new char[(capacity + 1) * sizeof(char) + sizeof(Data)];
    newData->str = (char*)((byte*)newData + sizeof(Data));
    if(data->len > 0)
    {
      Memory::copy((char*)newData->str, data->str, (data->len < copyLength ? data->len : copyLength) * sizeof(char));
      ((char*)newData->str)[newData->len = copyLength] = '\0';
    }
    else
    {
      *(char*)newData->str = '\0';
      newData->len = copyLength;
    }
    newData->ref = 1;
    newData->capacity = capacity;

    if(data->ref && Atomic::decrement(data->ref) == 0)
      delete[] (char*)data;

    data = newData;
  }